

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

ssize_t Curl_send_plain(connectdata *conn,int num,void *mem,size_t len,CURLcode *code)

{
  int err;
  SessionHandle *data;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  CURLcode CVar4;
  
  sVar1 = send(conn->sock[num],mem,len,0x4000);
  *code = CURLE_OK;
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    err = *piVar2;
    CVar4 = CURLE_AGAIN;
    sVar1 = 0;
    if ((err != 4) && (err != 0xb)) {
      data = conn->data;
      pcVar3 = Curl_strerror(conn,err);
      Curl_failf(data,"Send failure: %s",pcVar3);
      (conn->data->state).os_errno = err;
      sVar1 = -1;
      CVar4 = CURLE_SEND_ERROR;
    }
    *code = CVar4;
  }
  return sVar1;
}

Assistant:

ssize_t Curl_send_plain(struct connectdata *conn, int num,
                        const void *mem, size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t bytes_written = swrite(sockfd, mem, len);

  *code = CURLE_OK;
  if(-1 == bytes_written) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefor
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      bytes_written=0;
      *code = CURLE_AGAIN;
    }
    else {
      failf(conn->data, "Send failure: %s",
            Curl_strerror(conn, err));
      conn->data->state.os_errno = err;
      *code = CURLE_SEND_ERROR;
    }
  }
  return bytes_written;
}